

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::ParseCCCharacter
          (ParseState *this,StringPiece *s,Rune *rp,StringPiece *whole_class,RegexpStatus *status)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  RegexpStatus *status_local;
  StringPiece *whole_class_local;
  Rune *rp_local;
  StringPiece *s_local;
  ParseState *this_local;
  
  iVar3 = StringPiece::size(s);
  if (iVar3 == 0) {
    RegexpStatus::set_code(status,kRegexpMissingBracket);
    RegexpStatus::set_error_arg(status,whole_class);
    this_local._7_1_ = false;
  }
  else {
    iVar3 = StringPiece::size(s);
    if ((0 < iVar3) && (cVar1 = StringPiece::operator[](s,0), cVar1 == '\\')) {
      bVar2 = ParseEscape(s,rp,status,this->rune_max_);
      return bVar2;
    }
    iVar3 = StringPieceToRune(rp,s,status);
    this_local._7_1_ = -1 < iVar3;
  }
  return this_local._7_1_;
}

Assistant:

bool Regexp::ParseState::ParseCCCharacter(StringPiece* s, Rune *rp,
                                          const StringPiece& whole_class,
                                          RegexpStatus* status) {
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    return false;
  }

  // Allow regular escape sequences even though
  // many need not be escaped in this context.
  if (s->size() >= 1 && (*s)[0] == '\\')
    return ParseEscape(s, rp, status, rune_max_);

  // Otherwise take the next rune.
  return StringPieceToRune(rp, s, status) >= 0;
}